

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O3

DdNode * Llb_ImgComputeCube(Aig_Man_t *pAig,Vec_Int_t *vNodeIds,DdManager *dd)

{
  int iVar1;
  abctime aVar2;
  DdNode *pDVar3;
  long lVar4;
  DdNode *f;
  
  aVar2 = dd->TimeStop;
  dd->TimeStop = 0;
  pDVar3 = Cudd_ReadOne(dd);
  Cudd_Ref(pDVar3);
  if (0 < vNodeIds->nSize) {
    lVar4 = 0;
    f = pDVar3;
    do {
      iVar1 = vNodeIds->pArray[lVar4];
      if (((long)iVar1 < 0) || (pAig->vObjs->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pDVar3 = Cudd_bddIthVar(dd,*(int *)((long)pAig->vObjs->pArray[iVar1] + 0x24));
      pDVar3 = Cudd_bddAnd(dd,f,pDVar3);
      Cudd_Ref(pDVar3);
      Cudd_RecursiveDeref(dd,f);
      lVar4 = lVar4 + 1;
      f = pDVar3;
    } while (lVar4 < vNodeIds->nSize);
  }
  Cudd_Deref(pDVar3);
  dd->TimeStop = aVar2;
  return pDVar3;
}

Assistant:

DdNode * Llb_ImgComputeCube( Aig_Man_t * pAig, Vec_Int_t * vNodeIds, DdManager * dd )
{
    DdNode * bProd, * bTemp;
    Aig_Obj_t * pObj;
    int i;
    abctime TimeStop;
    TimeStop = dd->TimeStop; dd->TimeStop = 0;
    bProd = Cudd_ReadOne(dd);   Cudd_Ref( bProd );
    Aig_ManForEachObjVec( vNodeIds, pAig, pObj, i )
    {
        bProd  = Cudd_bddAnd( dd, bTemp = bProd, Cudd_bddIthVar(dd, Aig_ObjId(pObj)) ); Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bProd );
    dd->TimeStop = TimeStop;
    return bProd;
}